

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetFullNameImported
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,
          ArtifactType artifact)

{
  string local_48;
  ArtifactType local_24;
  string *psStack_20;
  ArtifactType artifact_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  local_24 = artifact;
  psStack_20 = config;
  config_local = (string *)this;
  this_local = (cmGeneratorTarget *)__return_storage_ptr__;
  cmTarget::ImportedGetFullPath(&local_48,this->Target,config,artifact);
  cmsys::SystemTools::GetFilenameName(__return_storage_ptr__,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetFullNameImported(
  const std::string& config, cmStateEnums::ArtifactType artifact) const
{
  return cmSystemTools::GetFilenameName(
    this->Target->ImportedGetFullPath(config, artifact));
}